

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argParserAdvancedConfiguration.cpp
# Opt level: O2

int callBackInstallAutoCompletion(int index,char **buff)

{
  char cVar1;
  int iVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_308;
  string programName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  string script;
  string location;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  fstream fileWirter;
  ostream local_218 [512];
  
  std::__cxx11::string::string((string *)&programName,*buff,(allocator *)&fileWirter);
  poVar3 = std::operator<<((ostream *)&std::cout,"generate auto completion");
  std::endl<char,std::char_traits<char>>(poVar3);
  while( true ) {
    iVar2 = std::__cxx11::string::find((char *)&programName,0x10b4c3);
    if (iVar2 == -1) break;
    std::__cxx11::string::erase((ulong)&programName,0);
  }
  std::operator+(&location,&programName,".bash");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fileWirter,
                 &autoCompletionScript_abi_cxx11_,&programName);
  std::operator+(&script,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &fileWirter," \n");
  std::__cxx11::string::~string((string *)&fileWirter);
  std::operator+(&bStack_308,"complete -F _function ./",&programName);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fileWirter,
                 &bStack_308," \n");
  std::__cxx11::string::append((string *)&script);
  std::__cxx11::string::~string((string *)&fileWirter);
  std::__cxx11::string::~string((string *)&bStack_308);
  std::fstream::fstream(&fileWirter);
  std::fstream::open((string *)&fileWirter,(_Ios_Openmode)&location);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::operator+(&bStack_308,"failed to open ",&location);
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)&bStack_308);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&bStack_308);
    std::fstream::~fstream(&fileWirter);
    std::__cxx11::string::~string((string *)&script);
    std::__cxx11::string::~string((string *)&location);
    std::__cxx11::string::~string((string *)&programName);
    return index;
  }
  std::operator<<(local_218,(string *)&script);
  std::fstream::close();
  std::operator+(&local_2c8,"try it out with: \n\t \"source ",&programName);
  std::operator+(&bStack_308,&local_2c8,".bash\"");
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)&bStack_308);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)&bStack_308);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::operator+(&local_268,
                 "to persist the atuo completion by copying the .bash file to /etc/bash_completion.d/ with:  \n\t \"cp "
                 ,&programName);
  std::operator+(&local_248,&local_268,".bash  /etc/bash_completion.d/");
  std::operator+(&local_2c8,&local_248,&programName);
  std::operator+(&bStack_308,&local_2c8,".bash\" ");
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)&bStack_308);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)&bStack_308);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_268);
  exit(0);
}

Assistant:

int callBackInstallAutoCompletion(int index, char **buff) {
#ifdef __linux__
    string programName = string(buff[0]);
    cout << "generate auto completion" << endl;
    int i = 0;
    // extract Binary name
    while ((i = programName.find("/")) != string::npos) {
        programName.erase(0, i + 1);
    }
    string location = programName + ".bash";
    string script = autoCompletionScript + programName + " \n";
    script += "complete -F _function ./" + programName + " \n";
    fstream fileWirter;
    fileWirter.open(location, fstream::out | ios::trunc);
    if (!fileWirter.is_open()) {
        cout << "failed to open " + location << endl;
        return index;
    }
    fileWirter << script;
    fileWirter.close();

    cout << "try it out with: \n\t \"source " + programName + ".bash\"" << endl;
    cout << "to persist the atuo completion by copying the .bash file to /etc/bash_completion.d/ with:  \n\t \"cp "
            "" + programName + ".bash  /etc/bash_completion.d/" + programName + ".bash\" " << endl;

    exit(0);
#elif __WIN32
    cout << "Auto completion not (jet) suportet under Windows"<<endl;
#endif
    return index;
}